

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::Inverse(Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  Matrix result;
  Fraction FStack_38;
  Matrix local_30;
  
  GetInverse(&local_30,this,choice_type);
  Fraction::Fraction(&FStack_38,0);
  bVar1 = operator==(&local_30,&FStack_38);
  if (!bVar1) {
    this->n_ = local_30.n_;
    this->m_ = local_30.m_;
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::operator=(&this->elements_,&local_30.elements_);
  }
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_30.elements_);
  return !bVar1;
}

Assistant:

bool Matrix::Inverse(Options::ChoiceType choice_type) {
  Matrix result = GetInverse(choice_type);
  if (result == 0) {
    return false;
  } else {
    operator=(result);
    return true;
  }
}